

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_serialize_container
          (t_cpp_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  string *psVar1;
  byte bVar2;
  ulong uVar3;
  t_type *ptVar4;
  ostream *poVar5;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string iter;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)ttype;
  ttype_local = (t_type *)out;
  out_local = (ostream *)this;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar3 = (**(code **)(*(long *)prefix_local + 0x80))();
  if ((uVar3 & 1) == 0) {
    uVar3 = (**(code **)(*(long *)prefix_local + 0x78))();
    if ((uVar3 & 1) == 0) {
      uVar3 = (**(code **)(*(long *)prefix_local + 0x70))();
      if ((uVar3 & 1) != 0) {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
        poVar5 = std::operator<<(poVar5,"xfer += oprot->writeListBegin(");
        ptVar4 = t_list::get_elem_type((t_list *)prefix_local);
        type_to_enum_abi_cxx11_((string *)(iter.field_2._M_local_buf + 8),this,ptVar4);
        poVar5 = std::operator<<(poVar5,(string *)(iter.field_2._M_local_buf + 8));
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = std::operator<<(poVar5,"static_cast<uint32_t>(");
        poVar5 = std::operator<<(poVar5,(string *)prefix);
        poVar5 = std::operator<<(poVar5,".size()));");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(iter.field_2._M_local_buf + 8));
      }
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
      poVar5 = std::operator<<(poVar5,"xfer += oprot->writeSetBegin(");
      ptVar4 = t_set::get_elem_type((t_set *)prefix_local);
      type_to_enum_abi_cxx11_(&local_98,this,ptVar4);
      poVar5 = std::operator<<(poVar5,(string *)&local_98);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,"static_cast<uint32_t>(");
      poVar5 = std::operator<<(poVar5,(string *)prefix);
      poVar5 = std::operator<<(poVar5,".size()));");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
    poVar5 = std::operator<<(poVar5,"xfer += oprot->writeMapBegin(");
    ptVar4 = t_map::get_key_type((t_map *)prefix_local);
    type_to_enum_abi_cxx11_(&local_48,this,ptVar4);
    poVar5 = std::operator<<(poVar5,(string *)&local_48);
    poVar5 = std::operator<<(poVar5,", ");
    ptVar4 = t_map::get_val_type((t_map *)prefix_local);
    type_to_enum_abi_cxx11_(&local_78,this,ptVar4);
    poVar5 = std::operator<<(poVar5,(string *)&local_78);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,"static_cast<uint32_t>(");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5,".size()));");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"_iter",&local_f9);
  t_generator::tmp((string *)local_d8,(t_generator *)this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  ptVar4 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar4,(string *)&local_120);
  type_name_abi_cxx11_(&local_140,this,(t_type *)prefix_local,false,false);
  poVar5 = std::operator<<(poVar5,(string *)&local_140);
  poVar5 = std::operator<<(poVar5,"::const_iterator ");
  poVar5 = std::operator<<(poVar5,(string *)local_d8);
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_160);
  poVar5 = std::operator<<(poVar5,"for (");
  poVar5 = std::operator<<(poVar5,(string *)local_d8);
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = std::operator<<(poVar5,(string *)prefix);
  poVar5 = std::operator<<(poVar5,".begin(); ");
  poVar5 = std::operator<<(poVar5,(string *)local_d8);
  poVar5 = std::operator<<(poVar5," != ");
  poVar5 = std::operator<<(poVar5,(string *)prefix);
  poVar5 = std::operator<<(poVar5,".end(); ++");
  poVar5 = std::operator<<(poVar5,(string *)local_d8);
  poVar5 = std::operator<<(poVar5,")");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)ttype_local);
  bVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar4 = ttype_local;
  psVar1 = prefix_local;
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar4 = ttype_local;
    psVar1 = prefix_local;
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar4 = ttype_local;
      psVar1 = prefix_local;
      if ((bVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_1c0,(string *)local_d8);
        generate_serialize_list_element(this,(ostream *)ptVar4,(t_list *)psVar1,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_1a0,(string *)local_d8);
      generate_serialize_set_element(this,(ostream *)ptVar4,(t_set *)psVar1,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_180,(string *)local_d8);
    generate_serialize_map_element(this,(ostream *)ptVar4,(t_map *)psVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
  bVar2 = (**(code **)(*(long *)prefix_local + 0x80))();
  if ((bVar2 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)prefix_local + 0x78))();
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)prefix_local + 0x70))();
      if ((bVar2 & 1) != 0) {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
        poVar5 = std::operator<<(poVar5,"xfer += oprot->writeListEnd();");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
      poVar5 = std::operator<<(poVar5,"xfer += oprot->writeSetEnd();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)ttype_local);
    poVar5 = std::operator<<(poVar5,"xfer += oprot->writeMapEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)ttype_local);
  std::__cxx11::string::~string((string *)local_d8);
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    indent(out) << "xfer += oprot->writeMapBegin(" << type_to_enum(((t_map*)ttype)->get_key_type())
                << ", " << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += oprot->writeSetBegin(" << type_to_enum(((t_set*)ttype)->get_elem_type())
                << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += oprot->writeListBegin("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  }

  string iter = tmp("_iter");
  out << indent() << type_name(ttype) << "::const_iterator " << iter << ";" << endl << indent()
      << "for (" << iter << " = " << prefix << ".begin(); " << iter << " != " << prefix
      << ".end(); ++" << iter << ")" << endl;
  scope_up(out);
  if (ttype->is_map()) {
    generate_serialize_map_element(out, (t_map*)ttype, iter);
  } else if (ttype->is_set()) {
    generate_serialize_set_element(out, (t_set*)ttype, iter);
  } else if (ttype->is_list()) {
    generate_serialize_list_element(out, (t_list*)ttype, iter);
  }
  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "xfer += oprot->writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += oprot->writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += oprot->writeListEnd();" << endl;
  }

  scope_down(out);
}